

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O2

void Jf_ManDeriveMapping(Jf_Man_t *p)

{
  Jf_Par_t *pJVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Gia_Obj_t *pObj;
  int *piVar3;
  int v;
  uint i;
  
  pJVar1 = p->pPars;
  if (pJVar1->fCutMin != 0) {
    __assert_fail("!p->pPars->fCutMin",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                  ,0x60d,"void Jf_ManDeriveMapping(Jf_Man_t *)");
  }
  p_00 = Vec_IntAlloc(p->pGia->nObjs + (int)pJVar1->Edge + (int)pJVar1->Area * 2);
  Vec_IntFill(p_00,p->pGia->nObjs,0);
  for (v = 0; v < p->pGia->nObjs; v = v + 1) {
    pObj = Gia_ManObj(p->pGia,v);
    if (pObj == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pObj & 0x1fffffff) != 0 && -1 < (int)*(uint *)pObj) {
      iVar2 = Gia_ObjIsBuf(pObj);
      if (iVar2 == 0) {
        iVar2 = Gia_ObjRefNum(p->pGia,pObj);
        if (iVar2 != 0) {
          piVar3 = Jf_ObjCuts(p,v);
          Vec_IntWriteEntry(p_00,v,p_00->nSize);
          if ((p->pPars->fCutMin != 0) && (6 < (piVar3[1] & 0xfU))) {
            __assert_fail("!p->pPars->fCutMin || Jf_CutSize(pCut) <= 6",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                          ,0x616,"void Jf_ManDeriveMapping(Jf_Man_t *)");
          }
          Vec_IntPush(p_00,piVar3[1] & 0xfU);
          for (i = 1; i <= (piVar3[1] & 0xfU); i = i + 1) {
            iVar2 = Jf_CutVar(piVar3 + 1,i);
            Vec_IntPush(p_00,iVar2);
          }
          Vec_IntPush(p_00,v);
        }
      }
    }
  }
  if ((p_00->nCap != 0x10) && (p_00->nSize != p_00->nCap)) {
    __assert_fail("Vec_IntCap(vMapping) == 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                  ,0x61c,"void Jf_ManDeriveMapping(Jf_Man_t *)");
  }
  p->pGia->vMapping = p_00;
  return;
}

Assistant:

void Jf_ManDeriveMapping( Jf_Man_t * p )
{
    Vec_Int_t * vMapping;
    Gia_Obj_t * pObj; 
    int i, k, * pCut;
    assert( !p->pPars->fCutMin );
    vMapping = Vec_IntAlloc( Gia_ManObjNum(p->pGia) + (int)p->pPars->Edge + (int)p->pPars->Area * 2 );
    Vec_IntFill( vMapping, Gia_ManObjNum(p->pGia), 0 );
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        if ( Gia_ObjIsBuf(pObj) || Gia_ObjRefNum(p->pGia, pObj) == 0 )
            continue;
        pCut = Jf_ObjCutBest( p, i );
        Vec_IntWriteEntry( vMapping, i, Vec_IntSize(vMapping) );
        assert( !p->pPars->fCutMin || Jf_CutSize(pCut) <= 6 );
        Vec_IntPush( vMapping, Jf_CutSize(pCut) );
        for ( k = 1; k <= Jf_CutSize(pCut); k++ )
            Vec_IntPush( vMapping, Jf_CutVar(pCut, k) );
        Vec_IntPush( vMapping, i );
    }
    assert( Vec_IntCap(vMapping) == 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping) );
    p->pGia->vMapping = vMapping;
//    Gia_ManMappingVerify( p->pGia );
}